

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

void __thiscall benchmark::walltime::anon_unknown_1::WallTimeImp::WallTimeImp(WallTimeImp *this)

{
  undefined8 uVar1;
  WallTimeImp *pWVar2;
  WallTimeImp *extraout_RDX;
  undefined4 extraout_var;
  WallTimeImp *pWVar3;
  double dVar4;
  WallTime WVar5;
  CheckHandler local_40;
  undefined8 local_38;
  double kMaxErrorInterval;
  WallTimeImp *this_local;
  uint64_t high_1;
  uint64_t low_1;
  uint64_t high;
  uint64_t low;
  
  this->base_walltime_ = 0.0;
  this->base_cycletime_ = 0;
  this->cycles_per_second_ = 0;
  this->seconds_per_cycle_ = 0.0;
  this->last_adjust_time_ = 0;
  kMaxErrorInterval = (double)this;
  std::atomic<int>::atomic(&this->drift_adjust_,0);
  this->max_interval_cycles_ = 0;
  local_38 = 0x3f1a36e2eb1c432d;
  dVar4 = CyclesPerSecond();
  this->cycles_per_second_ = (long)dVar4;
  if (this->cycles_per_second_ != 0) {
    internal::GetNullLogInstance();
    this->seconds_per_cycle_ = 1.0 / (double)this->cycles_per_second_;
    this->max_interval_cycles_ = (long)((double)this->cycles_per_second_ * 0.0001);
    pWVar2 = this;
    pWVar3 = extraout_RDX;
    do {
      uVar1 = rdtsc();
      low_1 = CONCAT44((int)((ulong)pWVar3 >> 0x20),(int)((ulong)uVar1 >> 0x20));
      high = CONCAT44((int)((ulong)pWVar2 >> 0x20),(int)uVar1);
      this->base_cycletime_ = low_1 << 0x20 | high;
      WVar5 = Slow(this);
      this->base_walltime_ = WVar5;
      uVar1 = rdtsc();
      pWVar3 = (WallTimeImp *)CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
      high_1 = CONCAT44((int)((ulong)this >> 0x20),(int)uVar1);
      pWVar2 = (WallTimeImp *)(((long)pWVar3 << 0x20 | high_1) - this->base_cycletime_);
      this_local = pWVar3;
    } while (this->max_interval_cycles_ < (long)pWVar2);
    SetDrift(this,0.0);
    this->last_adjust_time_ = (uint32_t)((ulong)this->base_cycletime_ >> 0x20);
    return;
  }
  internal::CheckHandler::CheckHandler
            (&local_40,"cycles_per_second_ != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/walltime.cc"
             ,"WallTimeImp",0xa6);
  internal::CheckHandler::GetLog(&local_40);
  internal::CheckHandler::~CheckHandler(&local_40);
}

Assistant:

WallTimeImp::WallTimeImp()
    : base_walltime_(0.0), base_cycletime_(0),
      cycles_per_second_(0), seconds_per_cycle_(0.0),
      last_adjust_time_(0), drift_adjust_(0),
      max_interval_cycles_(0) {
  const double kMaxErrorInterval = 100e-6;
  cycles_per_second_ = static_cast<int64_t>(CyclesPerSecond());
  CHECK(cycles_per_second_ != 0);
  seconds_per_cycle_ = 1.0 / cycles_per_second_;
  max_interval_cycles_ =
      static_cast<int64_t>(cycles_per_second_ * kMaxErrorInterval);
  do {
    base_cycletime_ = cycleclock::Now();
    base_walltime_ = Slow();
  } while (cycleclock::Now() - base_cycletime_ > max_interval_cycles_);
  // We are now sure that "base_walltime" and "base_cycletime" were produced
  // within kMaxErrorInterval of one another.

  SetDrift(0.0);
  last_adjust_time_ = static_cast<uint32_t>(uint64_t(base_cycletime_) >> 32);
}